

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<char>_> *
kj::parse::Many_<const_kj::parse::CharGroup__&,_true>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,
          IteratorInput<char,_const_char_*> *input)

{
  ArrayDisposer *pAVar1;
  char cVar2;
  Maybe<kj::Array<char>_> *pMVar3;
  NullableValue<char> subResult;
  IteratorInput<char,_const_char_*> subInput;
  Results results;
  undefined1 local_84 [12];
  IteratorInput<char,_const_char_*> local_78;
  ArrayBuilder<char> local_58;
  
  local_58.endPtr = (char *)0x0;
  local_58.ptr = (char *)0x0;
  local_58.pos = (char *)0x0;
  local_84._4_8_ = __return_storage_ptr__;
  do {
    pAVar1 = (ArrayDisposer *)input->pos;
    if (pAVar1 == (ArrayDisposer *)input->end) break;
    local_78.parent = input;
    local_78.pos = (char *)pAVar1;
    local_78.end = input->end;
    local_78.best = (char *)pAVar1;
    CharGroup_::operator()((CharGroup_ *)local_84,(IteratorInput<char,_const_char_*> *)subParser);
    cVar2 = local_84[0];
    local_84[2] = local_84[0];
    if (local_84[0] == '\x01') {
      local_84[3] = local_84[1];
      (local_78.parent)->pos = local_78.pos;
      Vector<char>::add<char>((Vector<char> *)&local_58,local_84 + 3);
    }
    IteratorInput<char,_const_char_*>::~IteratorInput
              ((IteratorInput<char,_const_char_*> *)(local_84 + 0xc));
  } while (cVar2 != '\0');
  if (local_58.pos == local_58.ptr) {
    ((NullableValue<kj::Array<char>_> *)local_84._4_8_)->isSet = false;
    pMVar3 = (Maybe<kj::Array<char>_> *)local_84._4_8_;
  }
  else {
    Vector<char>::releaseAsArray((Array<char> *)(local_84 + 0xc),(Vector<char> *)&local_58);
    pMVar3 = (Maybe<kj::Array<char>_> *)local_84._4_8_;
    ((NullableValue<kj::Array<char>_> *)local_84._4_8_)->isSet = true;
    (((NullableValue<kj::Array<char>_> *)local_84._4_8_)->field_1).value.ptr =
         (char *)local_78.parent;
    (((NullableValue<kj::Array<char>_> *)local_84._4_8_)->field_1).value.size_ =
         (size_t)local_78.pos;
    (((NullableValue<kj::Array<char>_> *)local_84._4_8_)->field_1).value.disposer =
         (ArrayDisposer *)local_78.end;
    local_78.parent = (IteratorInput<char,_const_char_*> *)0x0;
    local_78.pos = (char *)0x0;
    Array<char>::~Array((Array<char> *)(local_84 + 0xc));
  }
  ArrayBuilder<char>::dispose(&local_58);
  return pMVar3;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }